

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdialog.cpp
# Opt level: O3

void __thiscall QFontDialogPrivate::updateSample(QFontDialogPrivate *this)

{
  QAbstractItemView *pQVar1;
  QArrayData *pQVar2;
  int *piVar3;
  long lVar4;
  long in_FS_OFFSET;
  QStringView QVar5;
  QArrayData *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  QModelIndex local_50;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QLineEdit::text((QString *)&local_50,this->sizeEdit);
  QVar5.m_data = (storage_type_conflict *)local_50.i;
  QVar5.m_size = (qsizetype)local_50.m.ptr;
  QString::toIntegral_helper(QVar5,(bool *)0x0,10);
  piVar3 = (int *)CONCAT44(local_50.c,local_50.r);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_50.c,local_50.r),2,0x10);
    }
  }
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = (QAbstractItemView *)this->familyList;
  QAbstractItemView::currentIndex(&local_50,pQVar1);
  lVar4 = (long)local_50.r;
  if (lVar4 < 0) {
    local_68 = (QArrayData *)0x0;
    uStack_60 = 0;
    local_58 = 0;
  }
  else {
    QAbstractItemView::model(pQVar1);
    QStringListModel::stringList();
    local_68 = *(QArrayData **)(local_50.i + lVar4 * 0xc * 2);
    uStack_60 = *(undefined8 *)(local_50.i + (lVar4 * 0xc + 4) * 2);
    local_58 = *(undefined8 *)(local_50.i + (lVar4 * 0xc + 8) * 2);
    if (local_68 != (QArrayData *)0x0) {
      LOCK();
      (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_68->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_50);
  }
  QFontDatabase::font((QString *)&local_38,(QString *)&local_68,(int)this + 0x3b0);
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,2,0x10);
    }
  }
  QAbstractButton::isChecked(&this->strikeout->super_QAbstractButton);
  QFont::setStrikeOut(SUB81(&local_38,0));
  QAbstractButton::isChecked(&this->underline->super_QAbstractButton);
  QFont::setUnderline(SUB81(&local_38,0));
  pQVar1 = (QAbstractItemView *)this->familyList;
  QAbstractItemView::currentIndex(&local_50,pQVar1);
  lVar4 = (long)local_50.r;
  if (-1 < lVar4) {
    QAbstractItemView::model(pQVar1);
    QStringListModel::stringList();
    pQVar2 = *(QArrayData **)(local_50.i + lVar4 * 0xc * 2);
    lVar4 = *(long *)(local_50.i + (lVar4 * 0xc + 8) * 2);
    if (pQVar2 == (QArrayData *)0x0) {
      QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_50);
    }
    else {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_50);
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
    if (lVar4 != 0) goto LAB_004fa72b;
  }
  QLineEdit::clear(this->sampleEdit);
LAB_004fa72b:
  updateSampleFont(this,(QFont *)&local_38);
  QFont::~QFont((QFont *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFontDialogPrivate::updateSample()
{
    // compute new font
    int pSize = sizeEdit->text().toInt();
    QFont newFont(QFontDatabase::font(familyList->currentText(), style, pSize));
    newFont.setStrikeOut(strikeout->isChecked());
    newFont.setUnderline(underline->isChecked());

    if (familyList->currentText().isEmpty())
        sampleEdit->clear();

    updateSampleFont(newFont);
}